

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * displayP4(Op *pOp,char *zTemp,int nTemp)

{
  long lVar1;
  undefined8 *puVar2;
  int *piVar3;
  int iVar4;
  uint in_EDX;
  char *in_RSI;
  long in_RDI;
  sqlite3_vtab *pVtab;
  Mem *pMem;
  FuncDef *pDef;
  CollSeq *pColl_1;
  int n;
  char *zColl;
  CollSeq *pColl;
  KeyInfo *pKeyInfo;
  int j;
  int i;
  char *zP4;
  char *local_78;
  int local_44;
  char *local_40;
  int local_28;
  int local_24;
  char *local_20;
  
  local_20 = in_RSI;
  switch(*(undefined1 *)(in_RDI + 1)) {
  case 0xffffffed:
    *in_RSI = '\0';
    break;
  case 0xffffffee:
    sqlite3_snprintf((int)(ulong)in_EDX,in_RSI,"program");
    break;
  default:
    local_20 = *(char **)(in_RDI + 0x10);
    if (local_20 == (char *)0x0) {
      *in_RSI = '\0';
      local_20 = in_RSI;
    }
    break;
  case 0xfffffff1:
    sqlite3_snprintf((int)(ulong)in_EDX,in_RSI,"intarray");
    break;
  case 0xfffffff2:
    sqlite3_snprintf((int)(ulong)in_EDX,in_RSI,"%d",(ulong)*(uint *)(in_RDI + 0x10));
    break;
  case 0xfffffff3:
    sqlite3_snprintf((int)(ulong)in_EDX,in_RSI,"%lld",**(undefined8 **)(in_RDI + 0x10));
    break;
  case 0xfffffff4:
    sqlite3_snprintf(**(int **)(in_RDI + 0x10),(char *)(ulong)in_EDX,in_RSI,"%.16g");
    break;
  case 0xfffffff6:
    sqlite3_snprintf((int)(ulong)in_EDX,in_RSI,"vtab:%p",
                     *(undefined8 *)(*(long *)(in_RDI + 0x10) + 0x10));
    break;
  case 0xfffffff8:
    piVar3 = *(int **)(in_RDI + 0x10);
    if ((*(ushort *)(piVar3 + 2) & 2) == 0) {
      if ((*(ushort *)(piVar3 + 2) & 4) == 0) {
        if ((*(ushort *)(piVar3 + 2) & 8) == 0) {
          if ((*(ushort *)(piVar3 + 2) & 1) == 0) {
            local_20 = "(blob)";
          }
          else {
            sqlite3_snprintf((int)(ulong)in_EDX,in_RSI,"NULL");
          }
        }
        else {
          sqlite3_snprintf(*piVar3,(char *)(ulong)in_EDX,in_RSI,"%.16g");
        }
      }
      else {
        sqlite3_snprintf((int)(ulong)in_EDX,in_RSI,"%lld",*(undefined8 *)piVar3);
      }
    }
    else {
      local_20 = *(char **)(piVar3 + 4);
    }
    break;
  case 0xfffffffa:
    lVar1 = *(long *)(in_RDI + 0x10);
    sqlite3_snprintf((int)(ulong)in_EDX,in_RSI,"k(%d",(ulong)*(ushort *)(lVar1 + 6));
    local_24 = sqlite3Strlen30(in_RSI);
    for (local_28 = 0; local_28 < (int)(uint)*(ushort *)(lVar1 + 6); local_28 = local_28 + 1) {
      puVar2 = *(undefined8 **)(lVar1 + 0x20 + (long)local_28 * 8);
      if (puVar2 == (undefined8 *)0x0) {
        local_78 = "nil";
      }
      else {
        local_78 = (char *)*puVar2;
      }
      local_40 = local_78;
      local_44 = sqlite3Strlen30(local_78);
      if ((local_44 == 6) && (iVar4 = memcmp(local_78,"BINARY",6), iVar4 == 0)) {
        local_40 = "B";
        local_44 = 1;
      }
      if ((int)(in_EDX - 6) < local_24 + local_44) {
        builtin_strncpy(in_RSI + local_24,",...",4);
        break;
      }
      in_RSI[local_24] = ',';
      iVar4 = local_24 + 1;
      if (*(char *)(*(long *)(lVar1 + 0x18) + (long)local_28) != '\0') {
        in_RSI[local_24 + 1] = '-';
        iVar4 = local_24 + 2;
      }
      local_24 = iVar4;
      memcpy(in_RSI + local_24,local_40,(long)(local_44 + 1));
      local_24 = local_44 + local_24;
    }
    in_RSI[local_24] = ')';
    in_RSI[local_24 + 1] = '\0';
    break;
  case 0xfffffffb:
    sqlite3_snprintf((int)(ulong)in_EDX,in_RSI,"%s(%d)",
                     *(undefined8 *)(*(short **)(in_RDI + 0x10) + 0x18),
                     (ulong)(uint)(int)**(short **)(in_RDI + 0x10));
    break;
  case 0xfffffffc:
    sqlite3_snprintf((int)(ulong)in_EDX,in_RSI,"(%.20s)",**(undefined8 **)(in_RDI + 0x10));
  }
  return local_20;
}

Assistant:

static char *displayP4(Op *pOp, char *zTemp, int nTemp){
  char *zP4 = zTemp;
  assert( nTemp>=20 );
  switch( pOp->p4type ){
    case P4_KEYINFO: {
      int i, j;
      KeyInfo *pKeyInfo = pOp->p4.pKeyInfo;
      assert( pKeyInfo->aSortOrder!=0 );
      sqlite3_snprintf(nTemp, zTemp, "k(%d", pKeyInfo->nField);
      i = sqlite3Strlen30(zTemp);
      for(j=0; j<pKeyInfo->nField; j++){
        CollSeq *pColl = pKeyInfo->aColl[j];
        const char *zColl = pColl ? pColl->zName : "nil";
        int n = sqlite3Strlen30(zColl);
        if( n==6 && memcmp(zColl,"BINARY",6)==0 ){
          zColl = "B";
          n = 1;
        }
        if( i+n>nTemp-6 ){
          memcpy(&zTemp[i],",...",4);
          break;
        }
        zTemp[i++] = ',';
        if( pKeyInfo->aSortOrder[j] ){
          zTemp[i++] = '-';
        }
        memcpy(&zTemp[i], zColl, n+1);
        i += n;
      }
      zTemp[i++] = ')';
      zTemp[i] = 0;
      assert( i<nTemp );
      break;
    }
    case P4_COLLSEQ: {
      CollSeq *pColl = pOp->p4.pColl;
      sqlite3_snprintf(nTemp, zTemp, "(%.20s)", pColl->zName);
      break;
    }
    case P4_FUNCDEF: {
      FuncDef *pDef = pOp->p4.pFunc;
      sqlite3_snprintf(nTemp, zTemp, "%s(%d)", pDef->zName, pDef->nArg);
      break;
    }
    case P4_INT64: {
      sqlite3_snprintf(nTemp, zTemp, "%lld", *pOp->p4.pI64);
      break;
    }
    case P4_INT32: {
      sqlite3_snprintf(nTemp, zTemp, "%d", pOp->p4.i);
      break;
    }
    case P4_REAL: {
      sqlite3_snprintf(nTemp, zTemp, "%.16g", *pOp->p4.pReal);
      break;
    }
    case P4_MEM: {
      Mem *pMem = pOp->p4.pMem;
      if( pMem->flags & MEM_Str ){
        zP4 = pMem->z;
      }else if( pMem->flags & MEM_Int ){
        sqlite3_snprintf(nTemp, zTemp, "%lld", pMem->u.i);
      }else if( pMem->flags & MEM_Real ){
        sqlite3_snprintf(nTemp, zTemp, "%.16g", pMem->u.r);
      }else if( pMem->flags & MEM_Null ){
        sqlite3_snprintf(nTemp, zTemp, "NULL");
      }else{
        assert( pMem->flags & MEM_Blob );
        zP4 = "(blob)";
      }
      break;
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    case P4_VTAB: {
      sqlite3_vtab *pVtab = pOp->p4.pVtab->pVtab;
      sqlite3_snprintf(nTemp, zTemp, "vtab:%p", pVtab);
      break;
    }
#endif
    case P4_INTARRAY: {
      sqlite3_snprintf(nTemp, zTemp, "intarray");
      break;
    }
    case P4_SUBPROGRAM: {
      sqlite3_snprintf(nTemp, zTemp, "program");
      break;
    }
    case P4_ADVANCE: {
      zTemp[0] = 0;
      break;
    }
    default: {
      zP4 = pOp->p4.z;
      if( zP4==0 ){
        zP4 = zTemp;
        zTemp[0] = 0;
      }
    }
  }
  assert( zP4!=0 );
  return zP4;
}